

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_log_m(REF_DBL *m_upper_tri,REF_DBL *log_m_upper_tri)

{
  uint uVar1;
  REF_DBL d [12];
  double local_78;
  double local_70;
  double local_68;
  
  uVar1 = ref_matrix_diag_m(m_upper_tri,&local_78);
  if (uVar1 == 0) {
    local_78 = log(local_78);
    local_70 = log(local_70);
    local_68 = log(local_68);
    ref_matrix_form_m(&local_78,log_m_upper_tri);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x1f5,
           "ref_matrix_log_m",(ulong)uVar1,"diag");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_log_m(REF_DBL *m_upper_tri,
                                    REF_DBL *log_m_upper_tri) {
  REF_DBL d[12];

  RSS(ref_matrix_diag_m(m_upper_tri, d), "diag");

  d[0] = log(d[0]);
  d[1] = log(d[1]);
  d[2] = log(d[2]);

  RSS(ref_matrix_form_m(d, log_m_upper_tri), "form m");

  return REF_SUCCESS;
}